

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall dg::pta::PointerIdPointsToSet::removeAny(PointerIdPointsToSet *this,PSNode *target)

{
  bool bVar1;
  Pointer *pPVar2;
  PSNode *in_RSI;
  PointerIDLookupTable *in_RDI;
  unsigned_long *ptrID;
  const_iterator __end2;
  const_iterator __begin2;
  PointersT *__range2;
  bool removed;
  PointersT tmp;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  unsigned_long local_98;
  unsigned_long *local_90;
  unsigned_long in_stack_ffffffffffffff78;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *in_stack_ffffffffffffff80;
  byte local_49;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)in_RDI);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::size(in_stack_ffffffffffffff80);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::reserve((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
             *)in_RDI,CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_49 = 0;
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)in_RDI);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::end((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
         *)in_RDI);
  while( true ) {
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator!=
                      ((const_iterator *)in_RDI,
                       (const_iterator *)
                       CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (!bVar1) break;
    local_98 = ADT::
               SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
               ::const_iterator::operator*((const_iterator *)in_RDI);
    local_90 = &local_98;
    pPVar2 = PointerIDLookupTable::get
                       (in_RDI,CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (pPVar2->target == in_RSI) {
      local_49 = 1;
    }
    else {
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::set(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++((const_iterator *)in_RDI);
  }
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::swap((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          *)in_RDI,
         (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
          *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::~SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)0x1676b9);
  return (bool)(local_49 & 1);
}

Assistant:

bool removeAny(PSNode *target) {
        decltype(pointers) tmp;
        tmp.reserve(pointers.size());
        bool removed = false;
        for (const auto &ptrID : pointers) {
            if (lookupTable.get(ptrID).target != target) {
                tmp.set(ptrID);
            } else {
                removed = true;
            }
        }

        tmp.swap(pointers);

        return removed;
    }